

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void * __thiscall ObjectBlockPool<8,_8192>::GetBasePointer(ObjectBlockPool<8,_8192> *this,void *ptr)

{
  LargeBlock<8,_8192> **ppLVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  LargeBlock<8,_8192> *pLVar7;
  uint uVar8;
  
  uVar5 = (this->sortedPages).count;
  if (uVar5 != 0) {
    ppLVar1 = (this->sortedPages).data;
    pLVar7 = *ppLVar1;
    if (pLVar7 <= ptr) {
      uVar6 = (ulong)(uVar5 - 1);
      pvVar3 = (void *)0x0;
      pvVar4 = pvVar3;
      if (ptr <= ppLVar1[uVar6] + 1) {
        uVar5 = 0;
        while (uVar8 = uVar5, 1 < (int)uVar6 - uVar8) {
          uVar2 = uVar8 + (int)uVar6 >> 1;
          pvVar3 = (void *)(ulong)uVar2;
          pLVar7 = ppLVar1[(long)pvVar3];
          uVar5 = uVar8;
          if (pLVar7 < ptr) {
            uVar5 = uVar2;
          }
          if (ptr < pLVar7) {
            uVar6 = (ulong)uVar2;
            uVar5 = uVar8;
          }
        }
        uVar5 = 0xffffffff;
        if (pLVar7 <= ptr) {
          uVar5 = (uint)(pLVar7 + 1 < ptr);
        }
        uVar6 = (long)ptr - (long)ppLVar1[uVar5 + (int)pvVar3]->page;
        pvVar4 = (void *)0x0;
        if (uVar6 < 0x10001) {
          pvVar4 = (void *)((long)ppLVar1[uVar5 + (int)pvVar3]->page +
                           (ulong)((uint)uVar6 & 0x1fff8) + 8);
        }
      }
      return pvVar4;
    }
  }
  return (void *)0x0;
}

Assistant:

void* GetBasePointer(void* ptr)
	{
		if(sortedPages.count == 0 || ptr < sortedPages.data[0] || ptr > (char*)sortedPages.data[sortedPages.count - 1] + sizeof(MyLargeBlock))
			return NULL;

		// Binary search
		unsigned lowerBound = 0;
		unsigned upperBound = sortedPages.count - 1;
		unsigned pointer = 0;

		while(upperBound - lowerBound > 1)
		{
			pointer = (lowerBound + upperBound) >> 1;

			if(ptr < sortedPages.data[pointer])
				upperBound = pointer;
			else if(ptr > sortedPages.data[pointer])
				lowerBound = pointer;
		}

		if(ptr < sortedPages.data[pointer])
			pointer--;
		else if(ptr > (char*)sortedPages.data[pointer] + sizeof(MyLargeBlock))
			pointer++;

		MyLargeBlock *best = sortedPages.data[pointer];

		uintptr_t fromBase = (uintptr_t)((char*)ptr - (char*)best->page);

		if(fromBase > sizeof(best->page))
			return NULL;

		return (char*)best->page + (unsigned(fromBase) & ~(elemSize - 1)) + sizeof(markerType);
	}